

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O0

void __thiscall CVmObjTable::alloc_check_gc(CVmObjTable *this,int do_count)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI != 0) {
    *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
  }
  if (((*(byte *)(in_RDI + 0x78) & 1) != 0) &&
     ((*(uint *)(in_RDI + 0x68) < *(uint *)(in_RDI + 0x58) ||
      (*(ulong *)(in_RDI + 0x70) < *(ulong *)(in_RDI + 0x60))))) {
    gc_before_alloc((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void alloc_check_gc(VMG_ int do_count)
    {
        /* count the allocation if desired */
        if (do_count)
            ++allocs_since_gc_;

        /* if we've passed our threshhold for collecting garbage, do so now */
        if (gc_enabled_
            && (allocs_since_gc_ > max_allocs_between_gc_
                || bytes_since_gc_ > max_bytes_between_gc_))
            gc_before_alloc(vmg0_);
    }